

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O1

void __thiscall
lineage::SolutionGraph::SolutionGraph
          (SolutionGraph *this,ProblemGraph *problemGraph,Solution *solution)

{
  Digraph *this_00;
  Graph *graph;
  pointer *ppEVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_01;
  pointer pvVar2;
  ulong uVar3;
  Value VVar4;
  Value VVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  iterator __position;
  pointer pAVar8;
  pointer pAVar9;
  pointer pVVar10;
  pointer pAVar11;
  iterator __position_00;
  ulong uVar12;
  pointer puVar13;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_02;
  _Rb_tree_node_base *p_Var14;
  mapped_type *pmVar15;
  pointer puVar16;
  pointer pRVar17;
  ulong uVar18;
  pointer pAVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_03;
  unsigned_long uVar20;
  unsigned_long uVar21;
  ulong uVar22;
  mapped_type *pmVar23;
  pointer pAVar24;
  ulong uVar25;
  Index v0Component;
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  descendants;
  Index v1Component;
  SubgraphCutPerFrame subgraphCutPerFrame;
  ulong local_e0;
  undefined1 local_d8 [32];
  _Base_ptr local_b8;
  pointer pAStack_b0;
  pointer local_a8;
  ulong local_98;
  Solution *local_90;
  Partition<unsigned_long> local_88;
  vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
  *local_50;
  Value local_48;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  this->problemGraph_ = problemGraph;
  this->solution_ = solution;
  this_03 = &this->cellOfNode_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_03,((long)(problemGraph->problem_->nodes).
                            super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(problemGraph->problem_->nodes).
                            super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_d8);
  this_00 = &this->lineageGraph_;
  (this->lineageGraph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineageGraph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineageGraph_).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineageGraph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineageGraph_).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineageGraph_).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineageGraph_).multipleEdgesEnabled_ = false;
  (this->nodesOfCell_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodesOfCell_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodesOfCell_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  validate(problemGraph,solution);
  local_40.problem_ = this->problemGraph_->problem_;
  local_88.ranks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.ranks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.ranks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.numberOfSets_ = 0;
  graph = &problemGraph->graph_;
  local_90 = solution;
  local_40.edgeLabels_ = &solution->edge_labels;
  andres::graph::
  ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
  build<lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>
              *)&local_88,graph,&local_40);
  if (problemGraph->numberOfFrames_ != 1) {
    uVar18 = 0;
    do {
      local_d8._24_8_ = local_d8 + 8;
      local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
      local_d8._16_8_ = (_Base_ptr)0x0;
      pAStack_b0 = (pointer)0x0;
      pvVar2 = (problemGraph->nodeIndicesInFrame_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar16 = pvVar2[uVar18].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_b8 = (_Base_ptr)local_d8._24_8_;
      if (*(pointer *)
           ((long)&pvVar2[uVar18].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data + 8) != puVar16) {
        uVar25 = 0;
        do {
          uVar22 = puVar16[uVar25];
          uVar3 = uVar22;
          do {
            local_e0 = uVar3;
            uVar3 = local_88.parents_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[local_e0];
            uVar12 = uVar22;
          } while (local_88.parents_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[local_e0] != local_e0);
          while (local_e0 != uVar12) {
            uVar3 = local_88.parents_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12];
            local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar12] = local_e0;
            uVar12 = uVar3;
          }
          pRVar17 = (graph->vertices_).
                    super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (pAVar24 = *(pointer *)
                          &pRVar17[uVar22].vector_.
                           super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
              ; pAVar24 !=
                *(pointer *)
                 ((long)&pRVar17[uVar22].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                 + 8); pAVar24 = pAVar24 + 1) {
            VVar4 = pAVar24->vertex_;
            if ((uVar18 + 1 ==
                 (long)*(int *)((long)(this->problemGraph_->problem_->nodes).
                                      super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_start + VVar4 * 0x18)) &&
               (VVar5 = VVar4,
               (local_90->edge_labels).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[pAVar24->edge_] == '\0')) {
              do {
                local_48 = VVar5;
                VVar5 = local_88.parents_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[local_48];
              } while (local_88.parents_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[local_48] != local_48);
              while (local_48 != VVar4) {
                VVar5 = local_88.parents_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[VVar4];
                local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[VVar4] = local_48;
                VVar4 = VVar5;
              }
              this_02 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                         *)std::
                           map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                           ::operator[]((map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                                         *)local_d8,&local_e0);
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>(this_02,&local_48);
            }
            pRVar17 = (graph->vertices_).
                      super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar25 = uVar25 + 1;
          pvVar2 = (problemGraph->nodeIndicesInFrame_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar16 = pvVar2[uVar18].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar25 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[uVar18].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)puVar16 >> 3));
      }
      puVar13 = local_88.ranks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar16 = local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (p_Var14 = (_Rb_tree_node_base *)local_d8._24_8_;
          p_Var14 != (_Rb_tree_node_base *)(local_d8 + 8);
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
        if (p_Var14[2]._M_left == (_Base_ptr)0x1) {
          uVar21 = *(unsigned_long *)(p_Var14 + 1);
          uVar6 = *(unsigned_long *)(*(long *)(p_Var14 + 2) + 0x20);
          uVar7 = uVar21;
          do {
            uVar20 = uVar7;
            uVar7 = puVar16[uVar20];
          } while (puVar16[uVar20] != uVar20);
          while (uVar7 = uVar6, uVar20 != uVar21) {
            uVar7 = puVar16[uVar21];
            puVar16[uVar21] = uVar20;
            uVar21 = uVar7;
          }
          do {
            uVar21 = uVar7;
            uVar7 = puVar16[uVar21];
          } while (puVar16[uVar21] != uVar21);
          while (uVar21 != uVar6) {
            uVar7 = puVar16[uVar6];
            puVar16[uVar6] = uVar21;
            uVar6 = uVar7;
          }
          if (puVar13[uVar20] < puVar13[uVar21]) {
            puVar16[uVar20] = uVar21;
          }
          else if (puVar13[uVar21] < puVar13[uVar20]) {
            puVar16[uVar21] = uVar20;
          }
          else {
            if (uVar20 == uVar21) goto LAB_0010dae1;
            puVar16[uVar21] = uVar20;
            puVar13[uVar20] = puVar13[uVar20] + 1;
          }
          local_88.numberOfSets_ = local_88.numberOfSets_ - 1;
        }
LAB_0010dae1:
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                   *)local_d8);
      uVar18 = uVar18 + 1;
    } while (uVar18 < problemGraph->numberOfFrames_ - 1);
  }
  local_d8._16_8_ = (_Base_ptr)0x0;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_b8 = (_Base_ptr)0x0;
  pAStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::_M_fill_insert(&this_00->vertices_,
                   (this->lineageGraph_).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_88.numberOfSets_,
                   (value_type *)local_d8);
  if (local_b8 != (_Base_ptr)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
  }
  pmVar23 = (this_03->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_d8._24_8_ = local_d8 + 8;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
  local_d8._16_8_ = (_Base_ptr)0x0;
  pAStack_b0 = (pointer)0x0;
  local_b8 = (_Base_ptr)local_d8._24_8_;
  andres::Partition<unsigned_long>::representativeLabeling
            (&local_88,
             (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)local_d8);
  if (local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar25 = 0;
    uVar18 = uVar25;
    do {
      do {
        local_e0 = uVar18;
        uVar18 = local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_e0];
      } while (local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[local_e0] != local_e0);
      pmVar15 = std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)local_d8,&local_e0);
      *pmVar23 = *pmVar15;
      pmVar23 = pmVar23 + 1;
      uVar25 = uVar25 + 1;
      uVar18 = uVar25;
    } while (uVar25 < (ulong)((long)local_88.parents_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_88.parents_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)local_d8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->nodesOfCell_,
           (long)(this->lineageGraph_).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->lineageGraph_).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 6);
  local_d8._0_8_ = (pointer)0x0;
  puVar16 = (this->cellOfNode_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->cellOfNode_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar16) {
    do {
      this_01 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                ((this->nodesOfCell_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + puVar16[local_d8._0_8_]);
      __position._M_current = *(unsigned_long **)(this_01 + 8);
      if (__position._M_current == *(unsigned_long **)(this_01 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(this_01,__position,(unsigned_long *)local_d8);
      }
      else {
        *__position._M_current = local_d8._0_8_;
        *(unsigned_long **)(this_01 + 8) = __position._M_current + 1;
      }
      local_d8._0_8_ = (long)(Value *)local_d8._0_8_ + 1;
      puVar16 = (this->cellOfNode_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while ((ulong)local_d8._0_8_ <
             (pointer)((long)(this->cellOfNode_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar16 >> 3));
  }
  if (problemGraph->numberOfFrames_ != 1) {
    local_50 = (vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                *)&(this->lineageGraph_).edges_;
    uVar18 = 0;
    do {
      pvVar2 = (problemGraph->nodeIndicesInFrame_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar16 = pvVar2[uVar18].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_98 = uVar18;
      if (*(pointer *)
           ((long)&pvVar2[uVar18].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data + 8) != puVar16) {
        uVar25 = 0;
        do {
          uVar21 = puVar16[uVar25];
          pRVar17 = (graph->vertices_).
                    super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (pAVar24 = *(pointer *)
                          &pRVar17[uVar21].vector_.
                           super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
              ; pAVar24 !=
                *(pointer *)
                 ((long)&pRVar17[uVar21].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                 + 8); pAVar24 = pAVar24 + 1) {
            if ((uVar18 + 1 ==
                 (long)*(int *)((long)(this->problemGraph_->problem_->nodes).
                                      super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                               pAVar24->vertex_ * 0x18)) &&
               ((local_90->edge_labels).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[pAVar24->edge_] == '\0')) {
              puVar16 = (this_03->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
              pAVar8 = (pointer)puVar16[uVar21];
              pAVar9 = (pointer)puVar16[pAVar24->vertex_];
              if (pAVar8 != pAVar9) {
                if ((this->lineageGraph_).multipleEdgesEnabled_ != true) {
                  pVVar10 = (this_00->vertices_).
                            super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pAVar19 = *(pointer *)
                             &pVVar10[(long)pAVar8].to_.vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                  ;
                  pAVar11 = *(pointer *)((long)&pVVar10[(long)pAVar8].to_.vector_ + 8);
                  uVar22 = (long)pAVar11 - (long)pAVar19 >> 4;
                  while (uVar3 = uVar22, 0 < (long)uVar3) {
                    uVar22 = uVar3 >> 1;
                    if ((pointer)pAVar19[uVar22].vertex_ < pAVar9) {
                      pAVar19 = pAVar19 + uVar22 + 1;
                      uVar22 = ~uVar22 + uVar3;
                    }
                  }
                  if ((pAVar11 != pAVar19) && ((pointer)pAVar19->vertex_ == pAVar9))
                  goto LAB_0010de17;
                }
                __position_00._M_current =
                     (this->lineageGraph_).edges_.
                     super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_d8._0_8_ = pAVar8;
                local_d8._8_8_ = pAVar9;
                if (__position_00._M_current ==
                    (this->lineageGraph_).edges_.
                    super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                  ::_M_realloc_insert<andres::graph::detail::Edge<true,unsigned_long>>
                            (local_50,__position_00,(Edge<true,_unsigned_long> *)local_d8);
                }
                else {
                  (__position_00._M_current)->vertexIndices_[0] = (Value)pAVar8;
                  (__position_00._M_current)->vertexIndices_[1] = (Value)pAVar9;
                  ppEVar1 = &(this->lineageGraph_).edges_.
                             super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppEVar1 = *ppEVar1 + 1;
                }
                andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                insertAdjacenciesForEdge
                          (this_00,((long)(this->lineageGraph_).edges_.
                                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->lineageGraph_).edges_.
                                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
              }
            }
LAB_0010de17:
            pRVar17 = (graph->vertices_).
                      super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar25 = uVar25 + 1;
          pvVar2 = (problemGraph->nodeIndicesInFrame_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar16 = pvVar2[uVar18].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar25 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[uVar18].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)puVar16 >> 3));
      }
      uVar18 = local_98 + 1;
    } while (uVar18 < problemGraph->numberOfFrames_ - 1);
  }
  if (local_88.ranks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.ranks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.ranks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.ranks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.parents_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.parents_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.parents_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

SolutionGraph(const ProblemGraph& problemGraph, const Solution& solution) :
        problemGraph_(problemGraph),
        solution_(solution),
        cellOfNode_(problemGraph.problem().nodes.size())
    {
        typedef andres::graph::ComponentsByPartition<Graph> ComponentLabeling;
        typedef ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<Solution::EdgeLabels> SubgraphCutPerFrame;

        validate(problemGraph, solution);

        SubgraphCutPerFrame subgraphCutPerFrame(problem(), solution.edge_labels);
        ComponentLabeling componentsPerFrame;
        componentsPerFrame.build(problemGraph.graph(), subgraphCutPerFrame);

        // join components c0 (at time t) and c1 (at time t+1) iff
        // c1 is the unique descendant of c0
        for (size_t frame = 0; frame < problemGraph.numberOfFrames() - 1; ++frame)
        {
            std::map<size_t, std::set<size_t>> descendants;
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);
                auto v0Component = componentsPerFrame.partition_.find(v0);
                
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0);
                    it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto v1 = it->vertex();

                    if (problem().nodes[v1].t == frame + 1 && solution.edge_labels[it->edge()] == 0)
                    {
                        auto v1Component = componentsPerFrame.partition_.find(v1);

                        descendants[v0Component].insert(v1Component);
                    }
                }
            }

            for (auto& p: descendants)
                if (p.second.size() == 1)
                {
                    auto v0Component = p.first;
                    auto v1Component = *(p.second.begin());

                    componentsPerFrame.partition_.merge(v0Component, v1Component);
                }
        }

        lineageGraph_.insertVertices(componentsPerFrame.partition_.numberOfSets());
        // from now on, member function numberOfCells works

        componentsPerFrame.partition_.elementLabeling(cellOfNode_.begin());

        nodesOfCell_.resize(numberOfCells());
        for (size_t v = 0; v < numberOfNodes(); ++v)
            nodesOfCell_[cellOfNode_[v]].push_back(v);

        for (size_t frame = 0; frame < problemGraph.numberOfFrames() - 1; ++frame)
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0);
                    it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto v1 = it->vertex();

                    if (problem().nodes[v1].t == frame + 1 && solution.edge_labels[it->edge()] == 0)
                    {
                        auto c0 = cellOfNode_[v0];
                        auto c1 = cellOfNode_[v1];

                        if (c0 != c1)
                            lineageGraph_.insertEdge(c0, c1);
                    }
                }
            }
    }